

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

TPZFlopCounter __thiscall
TPZMatrix<TPZFlopCounter>::ConditionNumber
          (TPZMatrix<TPZFlopCounter> *this,int p,int64_t numiter,REAL tol)

{
  int iVar1;
  ostream *poVar2;
  TPZFlopCounter this_00;
  TPZFlopCounter invnorm;
  TPZFlopCounter thisnorm;
  TPZFMatrix<TPZFlopCounter> Inv;
  REAL localtol;
  int64_t localnumiter;
  undefined4 in_stack_00000120;
  int in_stack_00000134;
  TPZMatrix<TPZFlopCounter> *in_stack_00000138;
  TPZFlopCounter *in_stack_fffffffffffffed0;
  TPZFMatrix<TPZFlopCounter> *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  DecomposeType dec;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  TPZMatrix<TPZFlopCounter> *in_stack_ffffffffffffff18;
  TPZFlopCounter local_8;
  
  dec = (DecomposeType)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  TPZFMatrix<TPZFlopCounter>::TPZFMatrix(in_stack_ffffffffffffff00);
  MatrixNorm(in_stack_00000138,in_stack_00000134,(int64_t)this,(REAL)CONCAT44(p,in_stack_00000120));
  iVar1 = Inverse(in_stack_ffffffffffffff18,
                  (TPZFMatrix<TPZFlopCounter> *)
                  CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),dec);
  if (iVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "TVar TPZMatrix<TPZFlopCounter>::ConditionNumber(int, int64_t, REAL) [T = TPZFlopCounter]"
                            );
    poVar2 = std::operator<<(poVar2," - it was not possible to compute the inverse matrix.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    TPZFlopCounter::TPZFlopCounter(&local_8,(double *)&stack0xffffffffffffff18);
  }
  else {
    this_00 = MatrixNorm(in_stack_00000138,in_stack_00000134,(int64_t)this,
                         (REAL)CONCAT44(p,in_stack_00000120));
    local_8 = TPZFlopCounter::operator*(this_00.fVal,in_stack_fffffffffffffed0);
  }
  TPZFMatrix<TPZFlopCounter>::~TPZFMatrix((TPZFMatrix<TPZFlopCounter> *)0x130873e);
  return (TPZFlopCounter)local_8.fVal;
}

Assistant:

TVar TPZMatrix<TVar>::ConditionNumber(int p, int64_t numiter, REAL tol){
	int64_t localnumiter = numiter;
	REAL localtol = tol;
	TPZFMatrix<TVar> Inv;
	TVar thisnorm = this->MatrixNorm(p, localnumiter, localtol);
	if (!this->Inverse(Inv,ENoDecompose)){
		PZError << __PRETTY_FUNCTION__ << " - it was not possible to compute the inverse matrix." << std:: endl;
		return 0.;
	}
	TVar invnorm = Inv.MatrixNorm(p, numiter, tol);
	return thisnorm * invnorm;
}